

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

unsigned_fast_type math::wide_integer::detail::msb_helper<unsigned_int>(uint32_t *u)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = *u;
  uVar2 = (ulong)uVar1;
  uVar4 = (ulong)(uVar1 >> 0x10);
  if (0xffff >= uVar2) {
    uVar4 = uVar2;
  }
  uVar5 = (ulong)(0xffff < uVar2) * 0x10;
  uVar3 = uVar4 >> 8;
  uVar2 = uVar5 + 8;
  if ((uVar4 & 0xff00) == 0) {
    uVar3 = uVar4;
    uVar2 = uVar5;
  }
  uVar5 = uVar3 >> 4;
  uVar4 = uVar2 + 4;
  if ((uVar3 & 0xf0) == 0) {
    uVar5 = uVar3;
    uVar4 = uVar2;
  }
  uVar1 = (uint)(uVar5 >> 2);
  uVar2 = uVar4 + 2;
  if ((uVar5 & 0xc) == 0) {
    uVar1 = (uint)uVar5;
    uVar2 = uVar4;
  }
  return uVar1 >> 1 & 1 | uVar2;
}

Assistant:

constexpr auto msb_helper<std::uint32_t>(const std::uint32_t& u) -> unsigned_fast_type
  {
    auto r = static_cast<unsigned_fast_type>(UINT8_C(0));
    auto x = static_cast<std::uint_fast32_t>(u);

    // Use O(log2[N]) binary-halving in an unrolled loop to find the msb.
    if(static_cast<std::uint_fast32_t>(x & static_cast<std::uint_fast32_t>(UINT32_C(0xFFFF0000))) != static_cast<std::uint_fast32_t>(UINT8_C(0))) { x = static_cast<std::uint_fast32_t>(x >> static_cast<unsigned>(UINT8_C(16))); r = static_cast<unsigned_fast_type>(r | static_cast<unsigned_fast_type>(UINT8_C(16))); }
    if(static_cast<std::uint_fast32_t>(x & static_cast<std::uint_fast32_t>(UINT32_C(0x0000FF00))) != static_cast<std::uint_fast32_t>(UINT8_C(0))) { x = static_cast<std::uint_fast32_t>(x >> static_cast<unsigned>(UINT8_C( 8))); r = static_cast<unsigned_fast_type>(r | static_cast<unsigned_fast_type>(UINT8_C( 8))); }
    if(static_cast<std::uint_fast32_t>(x & static_cast<std::uint_fast32_t>(UINT32_C(0x000000F0))) != static_cast<std::uint_fast32_t>(UINT8_C(0))) { x = static_cast<std::uint_fast32_t>(x >> static_cast<unsigned>(UINT8_C( 4))); r = static_cast<unsigned_fast_type>(r | static_cast<unsigned_fast_type>(UINT8_C( 4))); }
    if(static_cast<std::uint_fast32_t>(x & static_cast<std::uint_fast32_t>(UINT32_C(0x0000000C))) != static_cast<std::uint_fast32_t>(UINT8_C(0))) { x = static_cast<std::uint_fast32_t>(x >> static_cast<unsigned>(UINT8_C( 2))); r = static_cast<unsigned_fast_type>(r | static_cast<unsigned_fast_type>(UINT8_C( 2))); }
    if(static_cast<std::uint_fast32_t>(x & static_cast<std::uint_fast32_t>(UINT32_C(0x00000002))) != static_cast<std::uint_fast32_t>(UINT8_C(0))) {                                                                               r = static_cast<unsigned_fast_type>(r | static_cast<unsigned_fast_type>(UINT8_C( 1))); }

    return r;
  }